

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

void lwlog::registry::init_default_logger(void)

{
  unique_ptr<lwlog::interface::logger,_std::default_delete<lwlog::interface::logger>_> uVar1;
  _Head_base<0UL,_lwlog::interface::logger_*,_false> _Var2;
  _Head_base<0UL,_lwlog::interface::logger_*,_false> local_10;
  
  std::
  make_unique<lwlog::logger<lwlog::configuration<lwlog::disable_local_time,lwlog::enable_thread_id,lwlog::enable_process_id,lwlog::enable_topics>,lwlog::synchronous_policy,lwlog::immediate_flush_policy,lwlog::single_threaded_policy,lwlog::sinks::stdout_sink>,char_const(&)[8]>
            ((char (*) [8])&local_10);
  _Var2._M_head_impl = local_10._M_head_impl;
  uVar1 = s_default_logger;
  local_10._M_head_impl = (logger *)0x0;
  s_default_logger._M_t.
  super___uniq_ptr_impl<lwlog::interface::logger,_std::default_delete<lwlog::interface::logger>_>.
  _M_t.
  super__Tuple_impl<0UL,_lwlog::interface::logger_*,_std::default_delete<lwlog::interface::logger>_>
  .super__Head_base<0UL,_lwlog::interface::logger_*,_false>._M_head_impl =
       (__uniq_ptr_data<lwlog::interface::logger,_std::default_delete<lwlog::interface::logger>,_true,_true>
        )(__uniq_ptr_data<lwlog::interface::logger,_std::default_delete<lwlog::interface::logger>,_true,_true>
          )_Var2._M_head_impl;
  if ((__uniq_ptr_impl<lwlog::interface::logger,_std::default_delete<lwlog::interface::logger>_>)
      uVar1._M_t.
      super___uniq_ptr_impl<lwlog::interface::logger,_std::default_delete<lwlog::interface::logger>_>
      ._M_t.
      super__Tuple_impl<0UL,_lwlog::interface::logger_*,_std::default_delete<lwlog::interface::logger>_>
      .super__Head_base<0UL,_lwlog::interface::logger_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<lwlog::interface::logger,_std::default_delete<lwlog::interface::logger>_>)0x0
     ) {
    (**(code **)(*(long *)uVar1._M_t.
                          super___uniq_ptr_impl<lwlog::interface::logger,_std::default_delete<lwlog::interface::logger>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_lwlog::interface::logger_*,_std::default_delete<lwlog::interface::logger>_>
                          .super__Head_base<0UL,_lwlog::interface::logger_*,_false>._M_head_impl + 8
                ))();
    if (local_10._M_head_impl != (logger *)0x0) {
      (*(local_10._M_head_impl)->_vptr_logger[1])();
    }
  }
  return;
}

Assistant:

void registry::init_default_logger()
	{
		s_default_logger = std::make_unique<
			logger<
				configuration<
					disable_local_time, 
					enable_thread_id,
					enable_process_id, 
					enable_topics
				>,
				synchronous_policy,
				immediate_flush_policy,
				single_threaded_policy,
				sinks::stdout_sink
			>
		>("DEFAULT");
	}